

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void addArgumentToVtab(Parse *pParse)

{
  sqlite3 *db_00;
  Table *pTable;
  char *zArg;
  sqlite3 *db;
  int n;
  char *z;
  Parse *pParse_local;
  
  if (((pParse->sArg).z != (char *)0x0) && (pParse->pNewTable != (Table *)0x0)) {
    db_00 = pParse->db;
    pTable = pParse->pNewTable;
    zArg = sqlite3DbStrNDup(db_00,(pParse->sArg).z,(pParse->sArg).n);
    addModuleArgument(db_00,pTable,zArg);
  }
  return;
}

Assistant:

static void addArgumentToVtab(Parse *pParse){
  if( pParse->sArg.z && pParse->pNewTable ){
    const char *z = (const char*)pParse->sArg.z;
    int n = pParse->sArg.n;
    sqlite3 *db = pParse->db;
    addModuleArgument(db, pParse->pNewTable, sqlite3DbStrNDup(db, z, n));
  }
}